

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::Rehash(World *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference ppMVar3;
  reference this_00;
  pointer pNVar4;
  unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_> *npc;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  *__range1_1;
  Map *map;
  iterator __end1;
  iterator __begin1;
  vector<Map_*,_std::allocator<Map_*>_> *__range1;
  runtime_error *e;
  key_type local_218;
  string local_1f8;
  allocator local_1d1;
  key_type local_1d0;
  string local_1b0;
  allocator local_189;
  key_type local_188;
  string local_168;
  allocator local_141;
  key_type local_140;
  string local_120;
  allocator local_f9;
  key_type local_f8;
  string local_d8;
  allocator local_b1;
  key_type local_b0;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  World *local_10;
  World *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"config.ini",&local_31);
  Config::Read(&this->config,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"admin.ini",&local_69);
  Config::Read(&this->admin_config,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"DropsFile",&local_b1);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_b0);
  util::variant::operator_cast_to_string(&local_90,pmVar2);
  Config::Read(&this->drops_config,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"ShopsFile",&local_f9);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_f8);
  util::variant::operator_cast_to_string(&local_d8,pmVar2);
  Config::Read(&this->shops_config,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"ArenasFile",&local_141);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_140);
  util::variant::operator_cast_to_string(&local_120,pmVar2);
  Config::Read(&this->arenas_config,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"FormulasFile",&local_189);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_188);
  util::variant::operator_cast_to_string(&local_168,pmVar2);
  Config::Read(&this->formulas_config,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"HomeFile",&local_1d1);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_1d0);
  util::variant::operator_cast_to_string(&local_1b0,pmVar2);
  Config::Read(&this->home_config,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"SkillsFile",(allocator *)((long)&e + 7));
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_218);
  util::variant::operator_cast_to_string(&local_1f8,pmVar2);
  Config::Read(&this->skills_config,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  UpdateConfig(this);
  LoadHome(this);
  __end1 = std::vector<Map_*,_std::allocator<Map_*>_>::begin(&this->maps);
  map = (Map *)std::vector<Map_*,_std::allocator<Map_*>_>::end(&this->maps);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>
                                *)&map);
    if (!bVar1) break;
    ppMVar3 = __gnu_cxx::__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::
              operator*(&__end1);
    Map::LoadArena(*ppMVar3);
    __gnu_cxx::__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::operator++
              (&__end1);
  }
  __end1_1 = std::
             vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
             ::begin(&this->npc_data);
  npc = (unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_> *)
        std::
        vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
        ::end(&this->npc_data);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_*,_std::vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>_>
                        *)&npc);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_*,_std::vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>_>
              ::operator*(&__end1_1);
    pNVar4 = std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>::operator->(this_00);
    if (pNVar4->id != 0) {
      pNVar4 = std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>::operator->(this_00);
      NPC_Data::LoadShopDrop(pNVar4);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_*,_std::vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void World::Rehash()
{
	try
	{
		this->config.Read("config.ini");
		this->admin_config.Read("admin.ini");
		this->drops_config.Read(this->config["DropsFile"]);
		this->shops_config.Read(this->config["ShopsFile"]);
		this->arenas_config.Read(this->config["ArenasFile"]);
		this->formulas_config.Read(this->config["FormulasFile"]);
		this->home_config.Read(this->config["HomeFile"]);
		this->skills_config.Read(this->config["SkillsFile"]);
	}
	catch (std::runtime_error &e)
	{
		Console::Err(e.what());
	}

	this->UpdateConfig();
	this->LoadHome();

	UTIL_FOREACH(this->maps, map)
	{
		map->LoadArena();
	}

	UTIL_FOREACH_CREF(this->npc_data, npc)
	{
		if (npc->id != 0)
			npc->LoadShopDrop();
	}
}